

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCoreInlines.h
# Opt level: O3

bool __thiscall PowerCore::conditional(PowerCore *this,uint32_t BO,uint32_t BI)

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  
  bVar4 = true;
  bVar2 = true;
  if ((BO & 4) == 0) {
    puVar1 = &(this->super_PowerCoreState).ctr;
    *puVar1 = *puVar1 - 1;
    bVar2 = (*puVar1 == 0) != ((BO & 2) == 0);
  }
  if ((BO & 0x10) == 0) {
    uVar3 = 0x80000000U >> ((byte)BI & 0x1f) & (this->super_PowerCoreState).cr;
    if ((BO & 8) == 0) {
      bVar4 = uVar3 == 0;
    }
    else {
      bVar4 = uVar3 != 0;
    }
  }
  return (bool)(bVar2 & bVar4);
}

Assistant:

inline bool PowerCore::conditional(uint32_t BO, uint32_t BI)
{
    bool ctr_ok;
    if((BO & 0x4) == 0)
    {
        --ctr;
        ctr_ok = (BO & 0x2) ? ctr == 0 : ctr != 0;
    }
    else
    {
        ctr_ok = true;
    }
    bool cond_ok;
    if(BO & 0x10)
        cond_ok = true;
    else if(BO & 0x8)
        cond_ok = (cr & (0x80000000U >> BI)) != 0;
    else
        cond_ok = (cr & (0x80000000U >> BI)) == 0;

    return ctr_ok && cond_ok;
}